

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_parser.hpp
# Opt level: O2

void __thiscall
jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::read_bigfloat
          (basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_> *this,string_type *str,
          error_code *ec)

{
  byte *pbVar1;
  pointer puVar2;
  uint8_t *puVar3;
  byte bVar4;
  cbor_errc __e;
  size_t sVar5;
  uint64_t value;
  byte *pbVar6;
  int64_t iVar7;
  byte bVar8;
  char cVar9;
  uint64_t value_00;
  bigint n;
  basic_bigint<std::allocator<unsigned_char>_> local_78;
  basic_bigint<std::allocator<unsigned_char>_> local_50;
  
  sVar5 = get_size(this,ec);
  if (ec->_M_value != 0) {
    return;
  }
  if (sVar5 == 2) {
    pbVar6 = (this->source_).current_;
    if (pbVar6 < (this->source_).end_) {
      bVar8 = *pbVar6 >> 5;
      if (bVar8 == 0) {
        value = get_uint64_value(this,ec);
      }
      else {
        if (bVar8 != 1) goto LAB_001e7a41;
        value = get_int64_value(this,ec);
      }
      if (ec->_M_value != 0) {
        return;
      }
      pbVar6 = (this->source_).current_;
      pbVar1 = (this->source_).end_;
      if (pbVar6 < pbVar1) {
        bVar8 = *pbVar6;
        bVar4 = bVar8 >> 5;
        cVar9 = (char)str;
        if (bVar4 == 0) {
          value_00 = get_uint64_value(this,ec);
          if (ec->_M_value != 0) {
            return;
          }
          std::__cxx11::string::push_back(cVar9);
          std::__cxx11::string::push_back(cVar9);
        }
        else {
          if (bVar4 != 1) {
            if (bVar4 != 6) goto LAB_001e7a41;
            pbVar6 = pbVar6 + 1;
            (this->source_).current_ = pbVar6;
            if (pbVar6 < pbVar1) {
              if ((*pbVar6 & 0xe0) != 0x40) goto LAB_001e7ad6;
              puVar2 = (this->bytes_buffer_).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
              if ((this->bytes_buffer_).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish != puVar2) {
                (this->bytes_buffer_).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish = puVar2;
              }
              read_byte_string(this,&this->bytes_buffer_,ec);
              if (ec->_M_value == 0) {
                bVar8 = bVar8 & 0x1f;
                if (bVar8 == 3) {
                  std::__cxx11::string::push_back(cVar9);
                  std::__cxx11::string::push_back(cVar9);
                  puVar3 = (this->bytes_buffer_).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start;
                  basic_bigint<std::allocator<unsigned_char>_>::from_bytes_be
                            (&n,1,puVar3,
                             (long)(this->bytes_buffer_).
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3);
                  local_50.field_0._0_1_ = 2;
                  local_50.field_0.common_stor_.length_ = 1;
                  local_50.field_0.short_stor_.values_[0] = 1;
                  local_50.field_0.short_stor_.values_[1] = 0;
                  operator-(&local_78,&local_50,&n);
                  basic_bigint<std::allocator<unsigned_char>_>::operator=(&n,&local_78);
                  basic_bigint<std::allocator<unsigned_char>_>::destroy(&local_78);
                  basic_bigint<std::allocator<unsigned_char>_>::destroy(&local_50);
                  basic_bigint<std::allocator<unsigned_char>>::
                  write_string_hex<char,std::char_traits<char>,std::allocator<char>>
                            ((basic_bigint<std::allocator<unsigned_char>> *)&n,str);
                  (str->_M_dataplus)._M_p[2] = 'x';
                }
                else {
                  if (bVar8 != 2) goto LAB_001e7ad6;
                  std::__cxx11::string::push_back(cVar9);
                  std::__cxx11::string::push_back(cVar9);
                  puVar3 = (this->bytes_buffer_).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start;
                  basic_bigint<std::allocator<unsigned_char>_>::from_bytes_be
                            ((basic_bigint<std::allocator<unsigned_char>_> *)&n,1,puVar3,
                             (long)(this->bytes_buffer_).
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3);
                  basic_bigint<std::allocator<unsigned_char>>::
                  write_string_hex<char,std::char_traits<char>,std::allocator<char>>
                            ((basic_bigint<std::allocator<unsigned_char>> *)&n,str);
                }
                basic_bigint<std::allocator<unsigned_char>_>::destroy(&n);
                goto LAB_001e7ad6;
              }
              goto LAB_001e7a50;
            }
            goto LAB_001e7a45;
          }
          iVar7 = get_int64_value(this,ec);
          if (ec->_M_value != 0) {
            return;
          }
          std::__cxx11::string::push_back(cVar9);
          std::__cxx11::string::push_back(cVar9);
          std::__cxx11::string::push_back(cVar9);
          value_00 = -iVar7;
        }
        jsoncons::detail::integer_to_hex<unsigned_long,std::__cxx11::string>(value_00,str);
LAB_001e7ad6:
        std::__cxx11::string::push_back(cVar9);
        if ((long)value < 0) {
          std::__cxx11::string::push_back(cVar9);
          value = -value;
        }
        jsoncons::detail::integer_to_hex<unsigned_long,std::__cxx11::string>(value,str);
        return;
      }
    }
LAB_001e7a45:
    __e = unexpected_eof;
  }
  else {
LAB_001e7a41:
    __e = invalid_bigfloat;
  }
  std::error_code::operator=(ec,__e);
LAB_001e7a50:
  this->more_ = false;
  return;
}

Assistant:

void read_bigfloat(string_type& str, std::error_code& ec)
    {
        std::size_t size = get_size(ec);
        if (JSONCONS_UNLIKELY(ec))
        {
            return;
        }
        if (size != 2)
        {
            ec = cbor_errc::invalid_bigfloat;
            more_ = false;
            return;
        }

        auto c = source_.peek();
        if (JSONCONS_UNLIKELY(c.eof))
        {
            ec = cbor_errc::unexpected_eof;
            more_ = false;
            return;
        }
        int64_t exponent = 0;
        switch (get_major_type(c.value))
        {
            case jsoncons::cbor::detail::cbor_major_type::unsigned_integer:
            {
                exponent = get_uint64_value(ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                break;
            }
            case jsoncons::cbor::detail::cbor_major_type::negative_integer:
            {
                exponent = get_int64_value(ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                break;
            }
            default:
            {
                ec = cbor_errc::invalid_bigfloat;
                more_ = false;
                return;
            }
        }

        c = source_.peek();
        if (JSONCONS_UNLIKELY(c.eof))
        {
            ec = cbor_errc::unexpected_eof;
            more_ = false;
            return;
        }
        switch (get_major_type(c.value))
        {
            case jsoncons::cbor::detail::cbor_major_type::unsigned_integer:
            {
                uint64_t val = get_uint64_value(ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                str.push_back('0');
                str.push_back('x');
                jsoncons::detail::integer_to_hex(val, str);
                break;
            }
            case jsoncons::cbor::detail::cbor_major_type::negative_integer:
            {
                int64_t val = get_int64_value(ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                str.push_back('-');
                str.push_back('0');
                str.push_back('x');
                jsoncons::detail::integer_to_hex(static_cast<uint64_t>(-val), str);
                break;
            }
            case jsoncons::cbor::detail::cbor_major_type::semantic_tag:
            {
                uint8_t b;
                if (source_.read(&b, 1) == 0)
                {
                    ec = cbor_errc::unexpected_eof;
                    more_ = false;
                    return;
                }
                uint8_t tag = get_additional_information_value(b);

                c = source_.peek();
                if (JSONCONS_UNLIKELY(c.eof))
                {
                    ec = cbor_errc::unexpected_eof;
                    more_ = false;
                    return;
                }

                if (get_major_type(c.value) == jsoncons::cbor::detail::cbor_major_type::byte_string)
                {
                    bytes_buffer_.clear(); 
                    read_byte_string(bytes_buffer_, ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        more_ = false;
                        return;
                    }
                    if (tag == 2)
                    {
                        str.push_back('0');
                        str.push_back('x');
                        bigint n = bigint::from_bytes_be(1, bytes_buffer_.data(), bytes_buffer_.size());
                        n.write_string_hex(str);
                    }
                    else if (tag == 3)
                    {
                        str.push_back('-');
                        str.push_back('0');
                        bigint n = bigint::from_bytes_be(1, bytes_buffer_.data(), bytes_buffer_.size());
                        n = -1 - n;
                        n.write_string_hex(str);
                        str[2] = 'x'; // overwrite minus
                    }
                }
                break;
            }
            default:
            {
                ec = cbor_errc::invalid_bigfloat;
                more_ = false;
                return;
            }
        }

        str.push_back('p');
        if (exponent >=0)
        {
            jsoncons::detail::integer_to_hex(static_cast<uint64_t>(exponent), str);
        }
        else
        {
            str.push_back('-');
            jsoncons::detail::integer_to_hex(static_cast<uint64_t>(-exponent), str);
        }
    }